

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wdgl.cpp
# Opt level: O1

void rw::wdgl::uninstance(ObjPipeline *rwpipe,Atomic *atomic)

{
  byte *pbVar1;
  AttribDesc *a;
  uint uVar2;
  Geometry *this;
  InstanceDataHeader *pIVar3;
  _func_void_ObjPipeline_ptr_Atomic_ptr *p_Var4;
  uint32 uVar5;
  V3d *dst;
  uint8 *src;
  RGBA *pRVar6;
  TexCoords *dst_00;
  V3d *dst_01;
  long lVar7;
  int iVar8;
  float32 f [4];
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  ObjPipeline *local_38;
  
  this = atomic->geometry;
  if ((this->flags & 0x1000000) != 0) {
    local_38 = rwpipe;
    uVar5 = MeshHeader::guessNumTriangles(this->meshHeader);
    this->numTriangles = uVar5;
    Geometry::allocateData(this);
    pIVar3 = this->instData;
    if (0 < (int)pIVar3[1].platform) {
      pRVar6 = this->colors;
      dst_00 = this->texCoords[0];
      dst_01 = this->morphTargets->vertices;
      dst = this->morphTargets->normals;
      lVar7 = 0;
      do {
        uVar2 = *(uint *)(*(long *)(pIVar3 + 2) + lVar7 * 0x18);
        if (uVar2 < 4) {
          a = (AttribDesc *)(*(long *)(pIVar3 + 2) + lVar7 * 0x18);
          src = (uint8 *)((ulong)a->offset + *(long *)(pIVar3 + 6));
          switch(uVar2) {
          case 0:
            if (0 < this->numVertices) {
              iVar8 = 0;
              do {
                unpackattrib((float *)dst_01,src,a,1.0);
                dst_01 = dst_01 + 1;
                src = src + a->stride;
                iVar8 = iVar8 + 1;
              } while (iVar8 < this->numVertices);
            }
            break;
          case 1:
            if (0 < this->numVertices) {
              iVar8 = 0;
              do {
                unpackattrib((float *)dst_00,src,a,512.0);
                dst_00 = dst_00 + 1;
                src = src + a->stride;
                iVar8 = iVar8 + 1;
              } while (iVar8 < this->numVertices);
            }
            break;
          case 2:
            if (0 < this->numVertices) {
              iVar8 = 0;
              do {
                unpackattrib((float *)dst,src,a,1.0);
                dst = dst + 1;
                src = src + a->stride;
                iVar8 = iVar8 + 1;
              } while (iVar8 < this->numVertices);
            }
            break;
          case 3:
            iVar8 = this->numVertices;
            if (0 < iVar8) {
              do {
                unpackattrib(&local_48,src,a,1.0);
                pRVar6->red = (uint8)(int)(local_48 * 255.0);
                pRVar6->green = (uint8)(int)(local_44 * 255.0);
                pRVar6->blue = (uint8)(int)(local_40 * 255.0);
                pRVar6->alpha = (uint8)(int)(local_3c * 255.0);
                pRVar6 = pRVar6 + 1;
                src = src + a->stride;
                iVar8 = iVar8 + -1;
              } while (iVar8 != 0);
            }
          }
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < (int)pIVar3[1].platform);
    }
    p_Var4 = local_38[1].impl.instance;
    if (p_Var4 != (_func_void_ObjPipeline_ptr_Atomic_ptr *)0x0) {
      (*p_Var4)((ObjPipeline *)this,(Atomic *)this);
    }
    Geometry::generateTriangles(this,(int8 *)0x0);
    pbVar1 = (byte *)((long)&this->flags + 3);
    *pbVar1 = *pbVar1 & 0xfe;
    pIVar3 = this->instData;
    if ((pIVar3 != (InstanceDataHeader *)0x0) && (pIVar3->platform == 0xb)) {
      this->instData = (InstanceDataHeader *)0x0;
      (*DAT_00149da0)(*(undefined8 *)(pIVar3 + 2));
      (*DAT_00149da0)(*(undefined8 *)(pIVar3 + 6));
      (*DAT_00149da0)(pIVar3);
    }
  }
  return;
}

Assistant:

static void
uninstance(rw::ObjPipeline *rwpipe, Atomic *atomic)
{
	ObjPipeline *pipe = (ObjPipeline*)rwpipe;
	Geometry *geo = atomic->geometry;
	if((geo->flags & Geometry::NATIVE) == 0)
		return;
	assert(geo->instData != nil);
	assert(geo->instData->platform == PLATFORM_WDGL);
	geo->numTriangles = geo->meshHeader->guessNumTriangles();
	geo->allocateData();

	uint8 *p;
	TexCoords *texcoord = geo->texCoords[0];
	RGBA *color = geo->colors;
	V3d *vert = geo->morphTargets->vertices;
	V3d *norm = geo->morphTargets->normals;
	float32 f[4];

	InstanceDataHeader *header = (InstanceDataHeader*)geo->instData;
	for(int i = 0; i < header->numAttribs; i++){
		AttribDesc *a = &header->attribs[i];
		p = header->data + a->offset;

		switch(a->index){
		case 0:		// Vertices
			for(int32 i = 0; i < geo->numVertices; i++){
				unpackattrib((float32*)vert, p, a);
				vert++;
				p += a->stride;
			}
			break;

		case 1:		// texCoords
			for(int32 i = 0; i < geo->numVertices; i++){
				unpackattrib((float32*)texcoord, p, a, 512.0f);
				texcoord++;
				p += a->stride;
			}
			break;

		case 2:		// normals
			for(int32 i = 0; i < geo->numVertices; i++){
				unpackattrib((float32*)norm, p, a);
				norm++;
				p += a->stride;
			}
			break;

		case 3:		// colors
			for(int32 i = 0; i < geo->numVertices; i++){
				// TODO: this seems too complicated
				unpackattrib(f, p, a);
				color->red   = f[0]*255.0f;
				color->green = f[1]*255.0f;
				color->blue  = f[2]*255.0f;
				color->alpha = f[3]*255.0f;
				color++;
				p += a->stride;
			}
			break;
		}
	}

	if(pipe->uninstanceCB)
		pipe->uninstanceCB(geo);

	geo->generateTriangles();

	geo->flags &= ~Geometry::NATIVE;
	destroyNativeData(geo, 0, 0);
}